

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::changeImplRowDualUpper
          (HPresolve *this,HighsInt row,double newUpper,HighsInt originCol)

{
  int oldImplVarUpperSource;
  HighsInt col;
  bool bVar1;
  bool bVar2;
  long lVar3;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *pvVar4;
  double dVar5;
  iterator __end1;
  iterator __begin1;
  HighsInt local_f4;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_f0;
  double local_e8;
  HighsInt local_dc [9];
  _Vector_base<int,_std::allocator<int>_> local_b8;
  int local_a0;
  iterator local_98;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> local_58;
  
  lVar3 = (long)row;
  local_e8 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar3];
  oldImplVarUpperSource =
       (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar3];
  dVar5 = -(this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  local_f4 = row;
  local_f0 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)newUpper;
  if ((dVar5 <= local_e8) && (newUpper < dVar5)) {
    markChangedRow(this,row);
  }
  bVar1 = isDualImpliedFree(this,row);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    dVar5 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] +
            (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
    if (local_e8 <= dVar5) {
      bVar1 = false;
    }
    else {
      bVar1 = (double)local_f0 <= dVar5;
    }
  }
  if (oldImplVarUpperSource != originCol) {
    if ((oldImplVarUpperSource != -1) &&
       (oldImplVarUpperSource !=
        (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3])) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                (&(this->implRowDualSourceByCol).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[oldImplVarUpperSource]._M_t,&local_f4);
    }
    if (originCol != -1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_emplace_unique<int&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((this->implRowDualSourceByCol).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + originCol),&local_f4);
    }
    (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_f4] = originCol;
    lVar3 = (long)local_f4;
  }
  (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar3] = (double)local_f0;
  if (!bVar1) {
    pvVar4 = local_f0;
    if (local_e8 <= (double)local_f0) {
      pvVar4 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_e8;
    }
    if ((this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3] <= (double)pvVar4) {
      return;
    }
  }
  local_58.nodeValue =
       (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58.nodeIndex =
       (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_58.nodeLeft =
       (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_58.nodeRight =
       (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_58.root =
       (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[lVar3];
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(&local_98,&local_58);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_dc[5] = 0;
  local_dc[6] = 0;
  local_dc[7] = 0;
  local_dc[8] = 0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_dc[1] = 0;
  local_dc[2] = 0;
  local_dc[3] = 0;
  local_dc[4] = 0;
  local_a0 = -1;
  local_f0 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
             &this->substitutionOpportunities;
  while (local_98.currentNode != local_a0) {
    HighsLinearSumBounds::updatedImplVarUpper
              (&this->impliedDualRowBounds,*local_98.pos_.index_,local_f4,*local_98.pos_.value_,
               local_e8,oldImplVarUpperSource);
    markChangedCol(this,*local_98.pos_.index_);
    if (bVar1) {
      col = *local_98.pos_.index_;
      bVar2 = isImpliedFree(this,col);
      if (bVar2) {
        local_dc[0] = col;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                  (local_f0,&local_f4,local_dc);
      }
    }
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_98);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_98.stack.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void HPresolve::changeImplRowDualUpper(HighsInt row, double newUpper,
                                       HighsInt originCol) {
  double oldImplUpper = implRowDualUpper[row];
  HighsInt oldUpperSource = rowDualUpperSource[row];

  if (oldImplUpper >= -options->dual_feasibility_tolerance &&
      newUpper < -options->dual_feasibility_tolerance)
    markChangedRow(row);

  bool newDualImplied =
      !isDualImpliedFree(row) &&
      oldImplUpper > rowDualUpper[row] + options->dual_feasibility_tolerance &&
      newUpper <= rowDualUpper[row] + options->dual_feasibility_tolerance;

  // remember the source of this upper bound, so that we can correctly identify
  // weak domination
  if (oldUpperSource != originCol) {
    if (oldUpperSource != -1 && oldUpperSource != rowDualLowerSource[row])
      implRowDualSourceByCol[oldUpperSource].erase(row);
    if (originCol != -1) implRowDualSourceByCol[originCol].emplace(row);

    rowDualUpperSource[row] = originCol;
  }

  // update implied bound
  implRowDualUpper[row] = newUpper;

  // nothing needs to be updated
  if (!newDualImplied && std::min(oldImplUpper, newUpper) >= rowDualUpper[row])
    return;

  for (const HighsSliceNonzero& nonzero : getRowVector(row)) {
    impliedDualRowBounds.updatedImplVarUpper(
        nonzero.index(), row, nonzero.value(), oldImplUpper, oldUpperSource);
    markChangedCol(nonzero.index());

    if (newDualImplied && isImpliedFree(nonzero.index()))
      substitutionOpportunities.emplace_back(row, nonzero.index());
  }
}